

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bspatch.c
# Opt level: O2

int bspatch(uint8_t *source,int64_t sourcesize,uint8_t *target,int64_t targetsize,
           bspatch_stream *stream)

{
  int64_t iVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  uint8_t *puVar8;
  uint8_t buf [8];
  long local_68;
  int64_t ctrl [3];
  
  local_68 = 0;
  lVar3 = 0;
  while( true ) {
    if (targetsize <= lVar3) {
      return 0;
    }
    for (lVar7 = 0; iVar1 = ctrl[0], lVar7 != 3; lVar7 = lVar7 + 1) {
      iVar2 = (*stream->read)(stream,buf,8);
      if (iVar2 != 0) {
        return -1;
      }
      uVar6 = (ulong)buf[0] |
              (ulong)buf[1] << 8 |
              ((ulong)buf[2] |
              (ulong)buf[3] << 8 |
              (ulong)((uint)buf[4] |
                     (uint)buf[5] << 8 | ((uint)buf[6] | (buf[7] & 0x7f) << 8) << 0x10) << 0x10) <<
              0x10;
      uVar4 = -uVar6;
      if (-1 < (char)buf[7]) {
        uVar4 = uVar6;
      }
      ctrl[lVar7] = uVar4;
    }
    lVar7 = lVar3 + ctrl[0];
    if (targetsize < lVar7) {
      return -1;
    }
    puVar8 = target + lVar3;
    iVar2 = (*stream->read)(stream,puVar8,(int)ctrl[0]);
    if (iVar2 != 0) {
      return -1;
    }
    lVar3 = 0;
    lVar5 = local_68;
    if (0 < iVar1) {
      lVar3 = iVar1;
    }
    while (lVar3 != 0) {
      if (lVar5 < sourcesize && -1 < lVar5) {
        *puVar8 = *puVar8 + source[lVar5];
      }
      puVar8 = puVar8 + 1;
      lVar3 = lVar3 + -1;
      lVar5 = lVar5 + 1;
    }
    lVar3 = ctrl[1] + lVar7;
    if (targetsize < lVar3) break;
    iVar2 = (*stream->read)(stream,target + lVar7,(int)ctrl[1]);
    if (iVar2 != 0) {
      return -1;
    }
    local_68 = iVar1 + local_68 + ctrl[2];
  }
  return -1;
}

Assistant:

int bspatch(const uint8_t* source, int64_t sourcesize, uint8_t* target, int64_t targetsize, struct bspatch_stream* stream)
{
	uint8_t buf[8];
	int64_t oldpos,newpos;
	int64_t ctrl[3];
	int64_t i;

	oldpos=0;newpos=0;
	while(newpos<targetsize) {
		/* Read control data */
		for(i=0;i<=2;i++) {
			if (stream->read(stream, buf, 8))
				return -1;
			ctrl[i]=offtin(buf);
		};

		/* Sanity-check */
		if(newpos+ctrl[0]>targetsize)
			return -1;

		/* Read diff string */
		if (stream->read(stream, target + newpos, ctrl[0]))
			return -1;

		/* Add old data to diff string */
		for(i=0;i<ctrl[0];i++)
			if((oldpos+i>=0) && (oldpos+i<sourcesize))
				target[newpos+i]+=source[oldpos+i];

		/* Adjust pointers */
		newpos+=ctrl[0];
		oldpos+=ctrl[0];

		/* Sanity-check */
		if(newpos+ctrl[1]>targetsize)
			return -1;

		/* Read extra string */
		if (stream->read(stream, target + newpos, ctrl[1]))
			return -1;

		/* Adjust pointers */
		newpos+=ctrl[1];
		oldpos+=ctrl[2];
	};

	return 0;
}